

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void iCopyColors<cRGBT,cBGRA,bCopy>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  BYTE BVar1;
  byte bVar2;
  undefined2 uVar3;
  int iVar4;
  EBlend EVar5;
  long lVar6;
  long lVar7;
  FSpecialColormap *pFVar8;
  uint uVar9;
  ulong uVar10;
  byte bVar11;
  byte bVar12;
  int iVar13;
  BYTE *pBVar14;
  byte *pbVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  
  pFVar8 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_0063894e_caseD_0:
    if (0 < count) {
      pBVar14 = pin + 2;
      lVar16 = 0;
      do {
        if (((pBVar14[-2] != tr) || (pBVar14[-1] != tg)) || (*pBVar14 != tb)) {
          pout[lVar16 * 4 + 2] = pBVar14[-2];
          pout[lVar16 * 4 + 1] = pBVar14[-1];
          pout[lVar16 * 4] = *pBVar14;
          pout[lVar16 * 4 + 3] = 0xff;
        }
        lVar16 = lVar16 + 1;
        pBVar14 = pBVar14 + step;
      } while (count != (int)lVar16);
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_0063894e_caseD_0;
    case BLEND_ICEMAP:
      if (0 < count) {
        pbVar15 = pin + 2;
        lVar16 = 0;
        do {
          bVar11 = pbVar15[-1];
          if ((pbVar15[-1] != tg || pbVar15[-2] != tr) || (bVar11 = tg, *pbVar15 != tb)) {
            uVar9 = (uint)bVar11 * 0x8f + (uint)pbVar15[-2] * 0x4d +
                    ((uint)*pbVar15 + (uint)*pbVar15 * 8) * 4 >> 0xc;
            BVar1 = IcePalette[uVar9][1];
            pout[lVar16 * 4 + 2] = IcePalette[uVar9][0];
            pout[lVar16 * 4 + 1] = BVar1;
            pout[lVar16 * 4] = IcePalette[uVar9][2];
            pout[lVar16 * 4 + 3] = 0xff;
          }
          lVar16 = lVar16 + 1;
          pbVar15 = pbVar15 + step;
        } while (count != (int)lVar16);
      }
      break;
    case BLEND_OVERLAY:
      if (0 < count) {
        pbVar15 = pin + 2;
        lVar16 = 0;
        do {
          bVar11 = pbVar15[-1];
          if ((pbVar15[-1] != tg || pbVar15[-2] != tr) || (bVar11 = tg, *pbVar15 != tb)) {
            iVar17 = inf->blendcolor[3];
            iVar13 = inf->blendcolor[1];
            bVar12 = *pbVar15;
            iVar4 = inf->blendcolor[2];
            pout[lVar16 * 4 + 2] = (BYTE)((uint)pbVar15[-2] * iVar17 + inf->blendcolor[0] >> 0x10);
            pout[lVar16 * 4 + 1] = (BYTE)((uint)bVar11 * iVar17 + iVar13 >> 0x10);
            pout[lVar16 * 4] = (BYTE)((uint)bVar12 * iVar17 + iVar4 >> 0x10);
            pout[lVar16 * 4 + 3] = 0xff;
          }
          lVar16 = lVar16 + 1;
          pbVar15 = pbVar15 + step;
        } while (count != (int)lVar16);
      }
      break;
    case BLEND_MODULATE:
      if (0 < count) {
        pbVar15 = pin + 2;
        lVar16 = 0;
        do {
          bVar11 = pbVar15[-1];
          if ((pbVar15[-1] != tg || pbVar15[-2] != tr) || (bVar11 = tg, *pbVar15 != tb)) {
            iVar17 = inf->blendcolor[1];
            bVar12 = *pbVar15;
            iVar13 = inf->blendcolor[2];
            pout[lVar16 * 4 + 2] = (BYTE)((uint)pbVar15[-2] * inf->blendcolor[0] >> 0x10);
            pout[lVar16 * 4 + 1] = (BYTE)((uint)bVar11 * iVar17 >> 0x10);
            pout[lVar16 * 4] = (BYTE)((uint)bVar12 * iVar13 >> 0x10);
            pout[lVar16 * 4 + 3] = 0xff;
          }
          lVar16 = lVar16 + 1;
          pbVar15 = pbVar15 + step;
        } while (count != (int)lVar16);
      }
      break;
    default:
      EVar5 = inf->blend;
      lVar16 = (long)EVar5;
      if (lVar16 < 0x21) {
        if ((BLEND_ICEMAP < EVar5) && (0 < count)) {
          iVar17 = 0x20 - EVar5;
          pbVar15 = pin + 2;
          lVar16 = 0;
          do {
            bVar11 = pbVar15[-2];
            bVar12 = pbVar15[-1];
            if ((pbVar15[-1] != tg || bVar11 != tr) || (bVar12 = tg, *pbVar15 != tb)) {
              bVar2 = *pbVar15;
              iVar13 = ((uint)bVar12 * 0x8f + (uint)bVar11 * 0x4d +
                        ((uint)bVar2 + (uint)bVar2 * 8) * 4 >> 8) * (EVar5 + BLEND_MODULATE);
              lVar18 = (long)(int)((uint)bVar11 * iVar17 + iVar13) * 0x84210843;
              lVar6 = (long)(int)((uint)bVar12 * iVar17 + iVar13) * 0x84210843;
              lVar7 = (long)(int)((uint)bVar2 * iVar17 + iVar13) * 0x84210843;
              pout[lVar16 * 4 + 2] = (char)(uint)((ulong)lVar18 >> 0x24) - (char)(lVar18 >> 0x3f);
              pout[lVar16 * 4 + 1] = (char)(uint)((ulong)lVar6 >> 0x24) - (char)(lVar6 >> 0x3f);
              pout[lVar16 * 4] = (char)(uint)((ulong)lVar7 >> 0x24) - (char)(lVar7 >> 0x3f);
              pout[lVar16 * 4 + 3] = 0xff;
            }
            lVar16 = lVar16 + 1;
            pbVar15 = pbVar15 + step;
          } while (count != (int)lVar16);
        }
      }
      else if (0 < count) {
        pbVar15 = pin + 2;
        lVar18 = 0;
        do {
          bVar11 = pbVar15[-1];
          if ((pbVar15[-1] != tg || pbVar15[-2] != tr) || (bVar11 = tg, *pbVar15 != tb)) {
            uVar10 = (ulong)((uint)bVar11 * 0x8f + (uint)pbVar15[-2] * 0x4d +
                             ((uint)*pbVar15 + (uint)*pbVar15 * 8) * 4 >> 8);
            uVar3 = *(undefined2 *)((long)pFVar8 + uVar10 * 4 + lVar16 * 0x518 + -0xa700);
            pout[lVar18 * 4 + 2] = *(BYTE *)((long)pFVar8 + uVar10 * 4 + lVar16 * 0x518 + -0xa6fe);
            *(undefined2 *)(pout + lVar18 * 4) = uVar3;
            pout[lVar18 * 4 + 3] = 0xff;
          }
          lVar18 = lVar18 + 1;
          pbVar15 = pbVar15 + step;
        } while (count != (int)lVar18);
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}